

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

vector sptk::swipe::spline(vector x,vector y)

{
  double *__ptr;
  double *in_RCX;
  int in_EDX;
  double *in_RSI;
  int in_EDI;
  double dVar1;
  double dVar2;
  vector vVar3;
  double *u;
  double sig;
  double qn;
  double p;
  int j;
  int i;
  vector y2;
  int local_38;
  int local_34;
  
  vVar3 = makev(0);
  __ptr = (double *)malloc((ulong)(in_EDI - 1) << 3);
  *vVar3.v = -0.5;
  *__ptr = (3.0 / (in_RSI[1] - *in_RSI)) * ((in_RCX[1] - *in_RCX) / (in_RSI[1] - *in_RSI) - 2.0);
  for (local_34 = 1; local_34 < in_EDI + -1; local_34 = local_34 + 1) {
    dVar1 = (in_RSI[local_34] - in_RSI[local_34 + -1]) /
            (in_RSI[local_34 + 1] - in_RSI[local_34 + -1]);
    dVar2 = dVar1 * vVar3.v[local_34 + -1] + 2.0;
    vVar3.v[local_34] = (dVar1 - 1.0) / dVar2;
    __ptr[local_34] =
         (in_RCX[local_34 + 1] - in_RCX[local_34]) / (in_RSI[local_34 + 1] - in_RSI[local_34]) -
         (in_RCX[local_34] - in_RCX[local_34 + -1]) / (in_RSI[local_34] - in_RSI[local_34 + -1]);
    __ptr[local_34] =
         (-dVar1 * __ptr[local_34 + -1] +
         (__ptr[local_34] * 6.0) / (in_RSI[local_34 + 1] - in_RSI[local_34 + -1])) / dVar2;
  }
  vVar3.v[(int)(vVar3.x - 1)] =
       ((3.0 / (in_RSI[in_EDI + -1] - in_RSI[in_EDI + -2])) *
        (2.0 - (in_RCX[in_EDX + -1] - in_RCX[in_EDX + -2]) /
               (in_RSI[in_EDI + -1] - in_RSI[in_EDI + -2])) + -(__ptr[in_EDI + -2] * 0.5)) /
       (vVar3.v[(int)(vVar3.x - 2)] * 0.5 + 1.0);
  for (local_38 = in_EDI + -2; -1 < local_38; local_38 = local_38 + -1) {
    vVar3.v[local_38] = vVar3.v[local_38] * vVar3.v[local_38 + 1] + __ptr[local_38];
  }
  free(__ptr);
  vVar3._4_4_ = 0;
  return vVar3;
}

Assistant:

vector spline(vector x, vector y) {
    int i, j;
    double p, qn, sig;
    vector y2 = makev(x.x);
#if 0
    double* u = malloc((unsigned) (x.x - 1) * sizeof(double));
#else
    double* u = (double*) malloc((unsigned) (x.x - 1) * sizeof(double));
#endif
    y2.v[0] = -.5; // left boundary
    u[0] = (3. / (x.v[1] - x.v[0])) * ((y.v[1] - y.v[0]) /
                                       (x.v[1] - x.v[0]) - YP1);
    for (i = 1; i < x.x - 1; i++) { // decomp loop
        sig = (x.v[i] - x.v[i - 1]) / (x.v[i + 1] - x.v[i - 1]);
        p = sig * y2.v[i - 1] + 2.;
        y2.v[i] = (sig - 1.) / p;
        u[i] = (y.v[i + 1] - y.v[i]) / (x.v[i + 1] - x.v[i]) -
               (y.v[i] - y.v[i - 1]) / (x.v[i] - x.v[i - 1]);
        u[i] = (6 * u[i] / (x.v[i + 1] - x.v[i - 1]) - sig * u[i - 1]) / p;
    }
    qn = .5; // right boundary
    y2.v[y2.x - 1] = ((3. / (x.v[x.x - 1] - x.v[x.x - 2])) * (YPN -
                      (y.v[y.x - 1] - y.v[y.x -  2]) / (x.v[x.x - 1] -
                       x.v[x.x - 2])) - qn * u[x.x - 2]) /
                       (qn * y2.v[y2.x - 2] + 1.);
    for (j = x.x - 2; j >= 0; j--) // backsubstitution loop
        y2.v[j] = y2.v[j] * y2.v[j + 1] + u[j];
    free(u);
    return(y2);
}